

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::PrefixIncDec(SQCompiler *this,SQInteger token)

{
  SQInteger SVar1;
  SQInteger SVar2;
  bool bVar3;
  undefined7 uVar4;
  int iVar5;
  long arg3;
  SQInteger SVar6;
  SQInteger tmp;
  SQInteger src;
  SQInteger diff;
  SQExpState es;
  SQInteger token_local;
  SQCompiler *this_local;
  
  iVar5 = 1;
  if (token == 0x130) {
    iVar5 = -1;
  }
  arg3 = (long)iVar5;
  Lex(this);
  SVar1 = (this->_es).etype;
  SVar2 = (this->_es).epos;
  bVar3 = (this->_es).donot_get;
  uVar4 = *(undefined7 *)&(this->_es).field_0x11;
  (this->_es).donot_get = true;
  PrefixedExpr(this);
  if ((this->_es).etype == 1) {
    Error(this,"can\'t \'++\' or \'--\' an expression");
  }
  else if (((this->_es).etype == 2) || ((this->_es).etype == 3)) {
    Emit2ArgsOP(this,_OP_INC,arg3);
  }
  else if ((this->_es).etype == 4) {
    SVar6 = SQFuncState::TopTarget(this->_fs);
    SQFuncState::AddInstruction(this->_fs,_OP_INCL,SVar6,SVar6,0,arg3);
  }
  else if ((this->_es).etype == 5) {
    SVar6 = SQFuncState::PushTarget(this->_fs,-1);
    SQFuncState::AddInstruction(this->_fs,_OP_GETOUTER,SVar6,(this->_es).epos,0,0);
    SQFuncState::AddInstruction(this->_fs,_OP_INCL,SVar6,SVar6,0,arg3);
    SQFuncState::AddInstruction(this->_fs,_OP_SETOUTER,SVar6,(this->_es).epos,SVar6,0);
  }
  (this->_es).etype = SVar1;
  (this->_es).epos = SVar2;
  (this->_es).donot_get = bVar3;
  *(undefined7 *)&(this->_es).field_0x11 = uVar4;
  return;
}

Assistant:

void PrefixIncDec(SQInteger token)
    {
        SQExpState  es;
        SQInteger diff = (token==TK_MINUSMINUS) ? -1 : 1;
        Lex();
        es = _es;
        _es.donot_get = true;
        PrefixedExpr();
        if(_es.etype==EXPR) {
            Error(_SC("can't '++' or '--' an expression"));
        }
        else if(_es.etype==OBJECT || _es.etype==BASE) {
            Emit2ArgsOP(_OP_INC, diff);
        }
        else if(_es.etype==LOCAL) {
            SQInteger src = _fs->TopTarget();
            _fs->AddInstruction(_OP_INCL, src, src, 0, diff);

        }
        else if(_es.etype==OUTER) {
            SQInteger tmp = _fs->PushTarget();
            _fs->AddInstruction(_OP_GETOUTER, tmp, _es.epos);
            _fs->AddInstruction(_OP_INCL,     tmp, tmp, 0, diff);
            _fs->AddInstruction(_OP_SETOUTER, tmp, _es.epos, tmp);
        }
        _es = es;
    }